

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O1

base_learner * recall_tree_setup(options_i *options,vw *all)

{
  uint32_t *location;
  size_t *location_00;
  size_t *location_01;
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  parser *ppVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  recall_tree *b;
  option_group_definition *poVar7;
  typed_option<float> *ptVar8;
  size_t sVar9;
  ostream *poVar10;
  size_t sVar11;
  base_learner *l;
  single_learner *base;
  learner<recall_tree_ns::recall_tree,_example> *plVar12;
  long lVar13;
  undefined **ppuVar14;
  label_parser *plVar15;
  char *__s;
  byte bVar16;
  size_type __dnew_6;
  size_type __dnew_5;
  option_group_definition new_options;
  size_type __dnew_4;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew;
  size_type __dnew_1;
  long local_990;
  long *local_988;
  long local_980;
  long local_978 [2];
  string local_968;
  _func_int ***local_948;
  _func_int **local_940;
  _func_int **local_938 [2];
  _func_int ***local_928;
  _func_int **local_920;
  _func_int **local_918 [2];
  _func_int ***local_908;
  _func_int **local_900;
  _func_int **local_8f8 [2];
  _func_int ***local_8e8;
  _func_int **local_8e0;
  _func_int **local_8d8 [2];
  string local_8c8;
  string local_8a8;
  string local_888;
  option_group_definition local_868;
  _func_int ***local_830;
  _func_int **local_828;
  _func_int **local_820 [2];
  string local_810;
  string local_7f0;
  undefined7 *local_7d0;
  undefined8 local_7c8;
  undefined7 local_7c0;
  undefined4 uStack_7b9;
  undefined1 local_7b5;
  undefined1 local_7b0 [112];
  bool local_740;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_728;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_718;
  undefined1 local_710 [112];
  bool local_6a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_688;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_678;
  undefined1 local_670 [112];
  bool local_600;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d8;
  undefined1 local_5d0 [112];
  bool local_560;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  undefined1 local_530 [112];
  bool local_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  typed_option<float> local_490;
  typed_option<bool> local_3f0;
  typed_option<bool> local_350;
  typed_option<unsigned_long> local_2b0;
  typed_option<float> local_210;
  typed_option<unsigned_long> local_170;
  typed_option<unsigned_int> local_d0;
  
  bVar16 = 0;
  b = calloc_or_throw<recall_tree_ns::recall_tree>(1);
  b->all = (vw *)0x0;
  b->k = 0;
  b->node_only = false;
  *(undefined3 *)&b->field_0xd = 0;
  (b->nodes)._begin = (node *)0x0;
  (b->nodes)._end = (node *)0x0;
  (b->nodes).end_array = (node *)0x0;
  (b->nodes).erase_count = 0;
  b->max_candidates = 0;
  b->max_routers = 0;
  b->max_depth = 0;
  b->bern_hyper = 0.0;
  b->randomized_routing = false;
  *(undefined3 *)&b->field_0x4d = 0;
  local_7c0 = 0x206c6c61636552;
  uStack_7b9 = 0x65657254;
  local_7c8 = 0xb;
  local_7b5 = 0;
  local_868.m_name._M_dataplus._M_p = (pointer)&local_868.m_name.field_2;
  local_7d0 = &local_7c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_868,&local_7c0);
  local_868.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_868.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_868.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_7d0 != &local_7c0) {
    operator_delete(local_7d0);
  }
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  local_888.field_2._M_allocated_capacity._0_7_ = 0x5f6c6c61636572;
  local_888.field_2._7_4_ = 0x65657274;
  local_888._M_string_length = 0xb;
  local_888.field_2._M_local_buf[0xb] = '\0';
  location = &b->k;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_7b0,&local_888,location);
  local_740 = true;
  local_8e8 = local_8d8;
  local_530._0_8_ = (_func_int **)0x1e;
  local_8e8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_8e8,(ulong)local_530);
  local_8d8[0] = (_func_int **)local_530._0_8_;
  builtin_strncpy((char *)((long)local_8e8 + 0xe),"e for mu",8);
  builtin_strncpy((char *)((long)local_8e8 + 0x16),"lticlass",8);
  *local_8e8 = (_func_int **)0x696c6e6f20657355;
  local_8e8[1] = (_func_int **)0x206565727420656e;
  local_8e0 = (_func_int **)local_530._0_8_;
  *(char *)((long)local_8e8 + local_530._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_7b0 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_7b0);
  poVar7 = VW::config::option_group_definition::add<unsigned_int>(&local_868,&local_d0);
  local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
  local_8a8.field_2._M_allocated_capacity._0_6_ = 0x61635f78616d;
  local_8a8.field_2._M_allocated_capacity._6_2_ = 0x646e;
  local_8a8.field_2._8_6_ = 0x736574616469;
  local_8a8._M_string_length = 0xe;
  local_8a8.field_2._M_local_buf[0xe] = '\0';
  location_00 = &b->max_candidates;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_530,&local_8a8,location_00);
  local_4c0 = true;
  local_908 = local_8f8;
  local_490.super_base_option._vptr_base_option = (_func_int **)0x2d;
  local_908 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_908,(ulong)&local_490);
  local_8f8[0] = local_490.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_908 + 0x1d),"leaf in ",8);
  builtin_strncpy((char *)((long)local_908 + 0x25),"the tree",8);
  local_908[2] = (_func_int **)0x736c6562616c2066;
  local_908[3] = (_func_int **)0x61656c2072657020;
  *local_908 = (_func_int **)0x206d756d6978616d;
  local_908[1] = (_func_int **)0x6f207265626d756e;
  local_900 = local_490.super_base_option._vptr_base_option;
  *(char *)((long)local_908 + (long)local_490.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_170,(typed_option<unsigned_long> *)local_530);
  poVar7 = VW::config::option_group_definition::add<unsigned_long>(poVar7,&local_170);
  local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
  local_8c8.field_2._M_allocated_capacity = 0x7079685f6e726562;
  local_8c8.field_2._8_2_ = 0x7265;
  local_8c8._M_string_length = 10;
  local_8c8.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<float>::typed_option(&local_490,&local_8c8,&b->bern_hyper);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_490,1.0);
  local_928 = local_918;
  local_5d0._0_8_ = (_func_int **)0x19;
  local_928 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_928,(ulong)local_5d0);
  local_918[0] = (_func_int **)local_5d0._0_8_;
  builtin_strncpy((char *)((long)local_928 + 9),"ee depth",8);
  builtin_strncpy((char *)((long)local_928 + 0x11)," penalty",8);
  *local_928 = (_func_int **)0x74206c6c61636572;
  local_928[1] = (_func_int **)0x7470656420656572;
  local_920 = (_func_int **)local_5d0._0_8_;
  *(char *)((long)local_928 + local_5d0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_210,ptVar8);
  poVar7 = VW::config::option_group_definition::add<float>(poVar7,&local_210);
  local_7f0.field_2._M_allocated_capacity = 0x747065645f78616d;
  local_7f0.field_2._8_2_ = 0x68;
  local_7f0._M_string_length = 9;
  location_01 = &b->max_depth;
  local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_5d0,&local_7f0,location_01);
  local_560 = true;
  local_670._0_8_ = (_func_int **)0x33;
  local_830 = local_820;
  local_830 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_830,(ulong)local_670);
  local_820[0] = (_func_int **)local_670._0_8_;
  local_830[4] = (_func_int **)0x325f676f6c20746c;
  local_830[5] = (_func_int **)0x7373616c63232820;
  local_830[2] = (_func_int **)0x6572742065687420;
  local_830[3] = (_func_int **)0x7561666564202c65;
  *local_830 = (_func_int **)0x206d756d6978616d;
  local_830[1] = (_func_int **)0x666f206874706564;
  builtin_strncpy((char *)((long)local_830 + 0x2f),"ses)",4);
  local_828 = (_func_int **)local_670._0_8_;
  *(char *)((long)local_830 + local_670._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2b0,(typed_option<unsigned_long> *)local_5d0);
  poVar7 = VW::config::option_group_definition::add<unsigned_long>(poVar7,&local_2b0);
  local_810.field_2._M_allocated_capacity = 0x6c6e6f5f65646f6e;
  local_810.field_2._8_2_ = 0x79;
  local_810._M_string_length = 9;
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_670,&local_810,&b->node_only);
  local_600 = true;
  local_948 = local_938;
  local_710._0_8_ = (_func_int **)0x2e;
  local_948 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_948,(ulong)local_710);
  local_938[0] = (_func_int **)local_710._0_8_;
  builtin_strncpy((char *)((long)local_948 + 0x1e),"ll path ",8);
  builtin_strncpy((char *)((long)local_948 + 0x26),"features",8);
  local_948[2] = (_func_int **)0x202c736572757461;
  local_948[3] = (_func_int **)0x6c6c756620746f6e;
  *local_948 = (_func_int **)0x65737520796c6e6f;
  local_948[1] = (_func_int **)0x65662065646f6e20;
  local_940 = (_func_int **)local_710._0_8_;
  *(char *)((long)local_948 + local_710._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_350,(typed_option<bool> *)local_670);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_350);
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  local_988 = (long *)0x12;
  local_968._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_968,(ulong)&local_988);
  local_968.field_2._M_allocated_capacity = (size_type)local_988;
  builtin_strncpy(local_968._M_dataplus._M_p,"randomized_routing",0x12);
  local_968._M_string_length = (size_type)local_988;
  local_968._M_dataplus._M_p[(long)local_988] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_710,&local_968,&b->randomized_routing);
  local_6a0 = true;
  local_990 = 0x12;
  local_988 = local_978;
  local_988 = (long *)std::__cxx11::string::_M_create((ulong *)&local_988,(ulong)&local_990);
  local_978[0] = local_990;
  *local_988 = 0x7a696d6f646e6172;
  local_988[1] = 0x6974756f72206465;
  *(undefined2 *)(local_988 + 2) = 0x676e;
  local_980 = local_990;
  *(char *)((long)local_988 + local_990) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_710 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_3f0,(typed_option<bool> *)local_710);
  VW::config::option_group_definition::add<bool>(poVar7,&local_3f0);
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cafb0;
  if (local_3f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_988 != local_978) {
    operator_delete(local_988);
  }
  local_710._0_8_ = &PTR__typed_option_002cafb0;
  if (local_678._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_678._M_pi);
  }
  if (local_688._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_688._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cafb0;
  if (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_948 != local_938) {
    operator_delete(local_948);
  }
  local_670._0_8_ = &PTR__typed_option_002cafb0;
  if (local_5d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d8._M_pi);
  }
  if (local_5e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb050;
  if (local_2b0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_830 != local_820) {
    operator_delete(local_830);
  }
  local_5d0._0_8_ = &PTR__typed_option_002cb050;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
    operator_delete(local_7f0._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_928 != local_918) {
    operator_delete(local_928);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb050;
  if (local_170.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_908 != local_8f8) {
    operator_delete(local_908);
  }
  local_530._0_8_ = &PTR__typed_option_002cb050;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    operator_delete(local_8a8._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0c0;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_8e8 != local_8d8) {
    operator_delete(local_8e8);
  }
  local_7b0._0_8_ = &PTR__typed_option_002cb0c0;
  if (local_718._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_718._M_pi);
  }
  if (local_728._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_728._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_7b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_868);
  pp_Var2 = (_func_int **)(local_7b0 + 0x10);
  local_7b0._16_6_ = 0x6c6c61636572;
  local_7b0[0x16] = 0x5f;
  local_7b0[0x17] = 0x74;
  local_7b0._24_2_ = 0x6572;
  local_7b0[0x1a] = 'e';
  local_7b0._8_8_ = (pointer)0xb;
  local_7b0[0x1b] = '\0';
  local_7b0._0_8_ = pp_Var2;
  iVar5 = (*options->_vptr_options_i[1])(options,local_7b0);
  if ((_func_int **)local_7b0._0_8_ != pp_Var2) {
    operator_delete((void *)local_7b0._0_8_);
  }
  if ((char)iVar5 == '\0') {
    plVar12 = (learner<recall_tree_ns::recall_tree,_example> *)0x0;
  }
  else {
    b->all = all;
    local_7b0._16_6_ = 0x61635f78616d;
    local_7b0[0x16] = 0x6e;
    local_7b0[0x17] = 100;
    local_7b0._24_2_ = 0x6469;
    local_7b0[0x1a] = 'a';
    local_7b0[0x1b] = 't';
    local_7b0._28_2_ = 0x7365;
    local_7b0._8_8_ = (pointer)0xe;
    local_7b0[0x1e] = '\0';
    local_7b0._0_8_ = pp_Var2;
    iVar5 = (*options->_vptr_options_i[1])(options);
    if ((char)iVar5 == '\0') {
      dVar4 = log((double)*location);
      dVar4 = ceil(dVar4 / 0.6931471805599453);
      uVar6 = (int)(long)dVar4 << 2;
      if (*location <= uVar6) {
        uVar6 = *location;
      }
      sVar9 = (size_t)uVar6;
    }
    else {
      sVar9 = *location_00;
    }
    *location_00 = sVar9;
    if ((_func_int **)local_7b0._0_8_ != pp_Var2) {
      operator_delete((void *)local_7b0._0_8_);
    }
    local_7b0._16_6_ = 0x65645f78616d;
    local_7b0[0x16] = 0x70;
    local_7b0[0x17] = 0x74;
    local_7b0._24_2_ = 0x68;
    local_7b0._8_8_ = (pointer)0x9;
    local_7b0._0_8_ = pp_Var2;
    iVar5 = (*options->_vptr_options_i[1])(options);
    if ((char)iVar5 == '\0') {
      dVar4 = log((double)*location);
      dVar4 = ceil(dVar4 / 0.6931471805599453);
      sVar9 = (long)dVar4 & 0xffffffff;
    }
    else {
      sVar9 = *location_01;
    }
    *location_01 = sVar9;
    if ((_func_int **)local_7b0._0_8_ != pp_Var2) {
      operator_delete((void *)local_7b0._0_8_);
    }
    recall_tree_ns::init_tree(b);
    if (all->quiet == false) {
      pvVar1 = &all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,"recall_tree:",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream," node_only = ",0xd)
      ;
      poVar10 = std::ostream::_M_insert<bool>(SUB81(pvVar1,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," bern_hyper = ",0xe);
      poVar10 = std::ostream::_M_insert<double>((double)b->bern_hyper);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," max_depth = ",0xd);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," routing = ",0xb);
      if (all->training == true) {
        __s = "deterministic";
        if (b->randomized_routing != false) {
          __s = "randomized";
        }
      }
      else {
        __s = "n/a testonly";
      }
      sVar11 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar11);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    ppVar3 = all->p;
    plVar12 = LEARNER::learner<recall_tree_ns::recall_tree,example>::
              init_learner<LEARNER::learner<char,example>>
                        (b,base,recall_tree_ns::learn,recall_tree_ns::predict,
                         (ulong)b->k + b->max_routers,multiclass);
    *(undefined8 *)(plVar12 + 0x58) = *(undefined8 *)(plVar12 + 0x18);
    *(code **)(plVar12 + 0x68) = MULTICLASS::finish_example<recall_tree_ns::recall_tree>;
    ppuVar14 = &MULTICLASS::mc_label;
    plVar15 = &ppVar3->lp;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      plVar15->default_label = (_func_void_void_ptr *)*ppuVar14;
      ppuVar14 = ppuVar14 + (ulong)bVar16 * -2 + 1;
      plVar15 = (label_parser *)((long)plVar15 + (ulong)bVar16 * -0x10 + 8);
    }
    *(code **)(plVar12 + 0x80) = recall_tree_ns::save_load_tree;
    *(undefined8 *)(plVar12 + 0x70) = *(undefined8 *)(plVar12 + 0x18);
    *(undefined8 *)(plVar12 + 0x78) = *(undefined8 *)(plVar12 + 0x20);
    *(undefined8 *)(plVar12 + 0xb8) = *(undefined8 *)(plVar12 + 0x18);
    *(undefined8 *)(plVar12 + 0xc0) = *(undefined8 *)(plVar12 + 0x20);
    *(code **)(plVar12 + 200) = recall_tree_ns::finish;
    b = (recall_tree *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_868.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868.m_name._M_dataplus._M_p != &local_868.m_name.field_2) {
    operator_delete(local_868.m_name._M_dataplus._M_p);
  }
  if (b != (recall_tree *)0x0) {
    free(b);
  }
  return (base_learner *)plVar12;
}

Assistant:

base_learner* recall_tree_setup(options_i& options, vw& all)
{
  auto tree = scoped_calloc_or_throw<recall_tree>();
  option_group_definition new_options("Recall Tree");
  new_options.add(make_option("recall_tree", tree->k).keep().help("Use online tree for multiclass"))
      .add(make_option("max_candidates", tree->max_candidates)
               .keep()
               .help("maximum number of labels per leaf in the tree"))
      .add(make_option("bern_hyper", tree->bern_hyper).default_value(1.f).help("recall tree depth penalty"))
      .add(make_option("max_depth", tree->max_depth).keep().help("maximum depth of the tree, default log_2 (#classes)"))
      .add(make_option("node_only", tree->node_only).keep().help("only use node features, not full path features"))
      .add(make_option("randomized_routing", tree->randomized_routing).keep().help("randomized routing"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("recall_tree"))
    return nullptr;

  tree->all = &all;
  tree->max_candidates = options.was_supplied("max_candidates")
      ? tree->max_candidates
      : (std::min)(tree->k, 4 * (uint32_t)(ceil(log(tree->k) / log(2.0))));
  tree->max_depth =
      options.was_supplied("max_depth") ? tree->max_depth : (uint32_t)std::ceil(std::log(tree->k) / std::log(2.0));

  init_tree(*tree.get());

  if (!all.quiet)
    all.trace_message << "recall_tree:"
                      << " node_only = " << tree->node_only << " bern_hyper = " << tree->bern_hyper
                      << " max_depth = " << tree->max_depth << " routing = "
                      << (all.training ? (tree->randomized_routing ? "randomized" : "deterministic") : "n/a testonly")
                      << std::endl;

  learner<recall_tree, example>& l = init_multiclass_learner(
      tree, as_singleline(setup_base(options, all)), learn, predict, all.p, tree->max_routers + tree->k);
  l.set_save_load(save_load_tree);
  l.set_finish(finish);

  return make_base(l);
}